

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *this,int dimension,
          unsigned_short *vertices,pair<int,_float> _data,int offset)

{
  iterator iVar1;
  runtime_error *this_00;
  unsigned_short *__k;
  bool bVar2;
  
  __k = vertices + offset;
  while( true ) {
    __k = __k + 1;
    bVar2 = dimension == 0;
    dimension = dimension + -1;
    if (bVar2) {
      *(pair<int,_float> *)(this + 4) = _data;
      return;
    }
    if (*(_Base_ptr *)(this + 0x10) == (_Base_ptr)0x0) break;
    iVar1 = std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
            ::find((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
                    *)*(_Base_ptr *)(this + 0x10),__k);
    if (iVar1._M_node == (_Base_ptr)&(*(_Base_ptr *)(this + 0x10))->_M_parent) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"A cell could not be found in the directed flag complex.");
      goto LAB_00141fbb;
    }
    this = (directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *)
           &iVar1._M_node[1]._M_parent;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"A cell could not be found in the directed flag complex.");
LAB_00141fbb:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_data(int dimension, const Cell vertices, ExtraData _data, int offset = 0) {
		if (dimension == 0) {
			data = _data;
			return;
		}

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		pair->second.set_data(dimension - 1, vertices, _data, offset);
	}